

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward_int8_x86
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  undefined4 uVar4;
  ulong uVar5;
  int *piVar6;
  void *pvVar7;
  _func_int **pp_Var8;
  Layer *pLVar9;
  uint _elempack;
  undefined1 auVar10 [14];
  undefined1 auVar11 [12];
  unkbyte10 Var12;
  undefined1 auVar13 [14];
  undefined1 auVar14 [12];
  unkbyte10 Var15;
  undefined1 auVar16 [12];
  int iVar17;
  size_t sVar18;
  undefined8 uVar19;
  undefined1 uVar20;
  int iVar21;
  _func_int **pp_Var22;
  _func_int *p_Var23;
  undefined4 *puVar24;
  long lVar25;
  long lVar26;
  void *pvVar27;
  float *pfVar28;
  int g_2;
  uint uVar29;
  void *pvVar30;
  long lVar31;
  int remain;
  int iVar32;
  int iVar33;
  int iVar34;
  ulong uVar35;
  ulong uVar36;
  int iVar37;
  ulong uVar38;
  _Vector_base<float,_std::allocator<float>_> *p_Var39;
  long lVar40;
  undefined1 (*pauVar41) [16];
  undefined1 (*pauVar42) [16];
  void *pvVar43;
  long lVar44;
  int remain_1;
  int iVar45;
  int k;
  ulong uVar46;
  int j;
  int iVar47;
  void *pvVar48;
  void *pvVar49;
  int g;
  ulong uVar50;
  undefined1 *puVar51;
  uint uVar52;
  ulong uVar53;
  long lVar54;
  void *pvVar55;
  bool bVar56;
  uint uVar57;
  undefined1 extraout_var [12];
  undefined1 auVar58 [16];
  undefined4 uVar59;
  ushort uVar60;
  int iVar61;
  ushort uVar71;
  float fVar72;
  ushort uVar74;
  int iVar75;
  ushort uVar78;
  int iVar79;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar62;
  float fVar76;
  float fVar80;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  ushort uVar70;
  ushort uVar73;
  ushort uVar77;
  ushort uVar81;
  undefined1 auVar69 [16];
  int iVar90;
  int iVar91;
  undefined1 in_XMM4 [16];
  __m128 pos;
  int iVar93;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar92;
  float fVar94;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  char cVar111;
  char cVar112;
  char cVar113;
  char cVar114;
  char cVar115;
  char cVar116;
  __m128 pos_1;
  undefined1 auVar95 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar117;
  float fVar118;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  __m128 _b;
  undefined1 auVar119 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar138;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar139;
  int iVar140;
  short sVar146;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar150;
  float fVar151;
  float fVar152;
  v4sf one;
  float fVar153;
  void *local_340;
  void *local_330;
  float *local_328;
  float *local_300;
  long local_2f8;
  Mat local_2c8;
  long local_280;
  float top_rescale;
  int iStack_274;
  Allocator *pAStack_270;
  Allocator *local_268;
  int iStack_260;
  undefined4 uStack_25c;
  Allocator *local_258;
  int iStack_250;
  int iStack_24c;
  int local_248;
  int iStack_244;
  int iStack_240;
  undefined4 uStack_23c;
  size_t local_238;
  Option opt_q;
  float scale_out;
  undefined4 uStack_1ac;
  int *local_1a8;
  Allocator *local_1a0;
  int local_198;
  long *local_190;
  bool local_188;
  bool bStack_187;
  bool bStack_186;
  bool bStack_185;
  bool local_184;
  bool bStack_183;
  bool bStack_182;
  bool bStack_181;
  int local_180;
  bool local_17c;
  bool bStack_17b;
  bool bStack_17a;
  bool bStack_179;
  int local_178;
  ulong local_170;
  Mat m_1;
  Mat local_120;
  _Vector_base<float,_std::allocator<float>_> local_d8;
  _Vector_base<float,_std::allocator<float>_> local_c0;
  _Vector_base<float,_std::allocator<float>_> local_a8;
  _Vector_base<float,_std::allocator<float>_> local_90;
  Option opt_g;
  short sVar82;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar141 [12];
  undefined1 auVar142 [16];
  
  local_120.c = bottom_blob->c;
  local_120.elempack = bottom_blob->elempack;
  local_120.elemsize = bottom_blob->elemsize;
  pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
  p_Var23 = pp_Var22[-3];
  iVar47 = *(int *)(&this->field_0xd4 + (long)p_Var23);
  iVar33 = *(int *)(&this->field_0xd8 + (long)p_Var23);
  iVar32 = *(int *)(&this->field_0xdc + (long)p_Var23);
  iVar45 = *(int *)(&this->field_0xe0 + (long)p_Var23);
  local_120.data = bottom_blob->data;
  local_120.refcount = bottom_blob->refcount;
  local_120.allocator = bottom_blob->allocator;
  local_120.dims = bottom_blob->dims;
  local_120.w = bottom_blob->w;
  local_120.h = bottom_blob->h;
  local_120.d = bottom_blob->d;
  local_120.cstep = bottom_blob->cstep;
  if (local_120.refcount != (int *)0x0) {
    LOCK();
    *local_120.refcount = *local_120.refcount + 1;
    UNLOCK();
    pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
  }
  if (local_120.elempack == 0 || ((int)local_120.elemsize * 8) / local_120.elempack != 8) {
    iVar61 = local_120.elempack * local_120.c;
    iVar21 = *(int *)(&this->field_0x108 + (long)pp_Var22[-3]);
    local_2c8.cstep = 0;
    local_2c8.data = (undefined4 *)0x0;
    local_2c8.refcount._0_4_ = 0;
    local_2c8.refcount._4_4_ = 0;
    local_2c8.elemsize._0_4_ = 0;
    local_2c8.elemsize._4_4_ = 0;
    local_2c8.elempack = 0;
    local_2c8.allocator = (Allocator *)0x0;
    local_2c8.dims = 0;
    local_2c8.w = 0;
    local_2c8.h = 0;
    local_2c8.d = 0;
    local_2c8.c = 0;
    lVar40 = 0;
    Mat::create(&local_2c8,iVar61,4,(Allocator *)0x0);
    iVar61 = iVar61 / iVar21;
    pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
    puVar24 = (undefined4 *)local_2c8.data;
    if (iVar61 < 1) {
      iVar61 = 0;
    }
    for (; lVar40 < *(int *)(&this->field_0x108 + (long)pp_Var22[-3]); lVar40 = lVar40 + 1) {
      uVar59 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)pp_Var22[-3]) + lVar40 * 4);
      iVar21 = iVar61;
      while (bVar56 = iVar21 != 0, iVar21 = iVar21 + -1, bVar56) {
        *puVar24 = uVar59;
        puVar24 = puVar24 + 1;
      }
    }
    opt_q.lightmode = opt->lightmode;
    opt_q._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_q.num_threads = opt->num_threads;
    opt_q.workspace_allocator = opt->workspace_allocator;
    opt_q.openmp_blocktime = opt->openmp_blocktime;
    opt_q.use_winograd_convolution = opt->use_winograd_convolution;
    opt_q.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_q.use_int8_inference = opt->use_int8_inference;
    opt_q.use_vulkan_compute = opt->use_vulkan_compute;
    opt_q.use_bf16_storage = opt->use_bf16_storage;
    opt_q.use_fp16_packed = opt->use_fp16_packed;
    opt_q.use_fp16_storage = opt->use_fp16_storage;
    opt_q.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_q.use_int8_packed = opt->use_int8_packed;
    opt_q.use_int8_storage = opt->use_int8_storage;
    opt_q.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_q.use_packing_layout = opt->use_packing_layout;
    opt_q.use_shader_pack8 = opt->use_shader_pack8;
    opt_q.use_subgroup_basic = opt->use_subgroup_basic;
    opt_q.use_subgroup_vote = opt->use_subgroup_vote;
    opt_q.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_q.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_q.use_image_storage = opt->use_image_storage;
    opt_q.use_tensor_storage = opt->use_tensor_storage;
    opt_q.use_reserved_0 = opt->use_reserved_0;
    opt_q.flush_denormals = opt->flush_denormals;
    opt_q.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_q.use_shader_local_memory = opt->use_shader_local_memory;
    opt_q.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_q.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_q.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_q.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_q.use_reserved_6 = opt->use_reserved_6;
    opt_q.use_reserved_7 = opt->use_reserved_7;
    opt_q.use_reserved_8 = opt->use_reserved_8;
    opt_q.use_reserved_9 = opt->use_reserved_9;
    opt_q.use_reserved_10 = opt->use_reserved_10;
    opt_q.use_reserved_11 = opt->use_reserved_11;
    opt_q.blob_allocator = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_120,&local_2c8,&opt_q);
    piVar6 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_2c8.allocator == (Allocator *)0x0) {
          free(local_2c8.data);
        }
        else {
          (*(local_2c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
  }
  local_2c8.cstep = 0;
  local_2c8.data = (void *)0x0;
  local_2c8.refcount._0_4_ = 0;
  local_2c8.refcount._4_4_ = 0;
  local_2c8.elemsize._0_4_ = 0;
  local_2c8.elemsize._4_4_ = 0;
  local_2c8.elempack = 0;
  local_2c8.allocator = (Allocator *)0x0;
  local_2c8.dims = 0;
  local_2c8.w = 0;
  local_2c8.h = 0;
  local_2c8.d = 0;
  local_2c8.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86 + (long)pp_Var22[-3]),&local_120,
             &local_2c8,opt);
  iVar79 = local_2c8.c;
  iVar75 = local_2c8.w;
  iVar34 = local_2c8.elempack;
  iVar21 = -100;
  iVar61 = iVar21;
  if ((local_2c8.data == (void *)0x0) || (local_2c8.cstep * (long)local_2c8.c == 0))
  goto LAB_003d5694;
  p_Var23 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar32 = (~((iVar47 + -1) * iVar32) + local_2c8.w) / *(int *)(&this->field_0xe4 + (long)p_Var23);
  iVar47 = (~((iVar33 + -1) * iVar45) + local_2c8.h) / *(int *)(&this->field_0xe8 + (long)p_Var23);
  iVar33 = iVar32 + 1;
  iVar45 = iVar47 + 1;
  uVar29 = local_2c8.elempack * local_2c8.c;
  uVar52 = 8;
  if ((uVar29 == *(uint *)(&this->field_0x108 + (long)p_Var23)) &&
     (uVar29 == *(uint *)(&this->field_0xd0 + (long)p_Var23))) {
    if (opt->use_packing_layout == false) {
      uVar52 = 1;
    }
    if ((uVar29 & 7) != 0) {
      uVar52 = 1;
    }
    iVar21 = *(int *)(&this->field_0x10c + (long)p_Var23);
    uVar57 = uVar52 * 4;
    if (100 < iVar21) {
      uVar57 = uVar52;
    }
    Mat::create(top_blob,iVar33,iVar45,(int)uVar29 / (int)uVar52,(ulong)uVar57,uVar52,
                opt->blob_allocator);
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_003d5694;
    if (iVar34 == 1) {
      pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
      p_Var23 = pp_Var22[-3];
      iVar33 = *(int *)(&this->field_0xd8 + (long)p_Var23);
      if (iVar33 == 3 && *(int *)(&this->field_0xd4 + (long)p_Var23) == 3) {
        if ((((*(int *)(&this->field_0xe4 + (long)p_Var23) == 1) &&
             (*(int *)(&this->field_0xe8 + (long)p_Var23) == 1)) &&
            (*(int *)(&this->field_0xdc + (long)p_Var23) == 1)) &&
           ((*(int *)(&this->field_0xe0 + (long)p_Var23) == 1 &&
            (*(uint *)(&this->field_0x110 + (long)p_Var23) < 2)))) {
          if (iVar21 < 0x65) {
            opt_q.workspace_allocator = (Allocator *)0x0;
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator = (Allocator *)0x0;
            lVar40 = 0;
            while( true ) {
              p_Var23 = pp_Var22[-3];
              if (*(int *)(&this->field_0x108 + (long)p_Var23) <= lVar40) break;
              _top_rescale = (void *)CONCAT44(iStack_274,
                                              1.0 / (*(float *)(*(long *)(&this->field_0x1f8 +
                                                                         (long)p_Var23) + lVar40 * 4
                                                               ) *
                                                    *(float *)(*(long *)(&this->field_0x240 +
                                                                        (long)p_Var23) + lVar40 * 4)
                                                    ));
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
              lVar40 = lVar40 + 1;
              pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_a8,
                       (vector<float,_std::allocator<float>_> *)&opt_q);
            iVar47 = top_blob->w;
            iVar33 = top_blob->h;
            pvVar7 = (this->weight_data_tm).data;
            lVar40 = *(long *)(&this->field_0x1b0 + (long)p_Var23);
            iVar32 = top_blob->d;
            pvVar49 = top_blob->data;
            uVar53 = top_blob->elemsize;
            lVar54 = top_blob->cstep * uVar53;
            lVar44 = (long)iVar33 * (long)iVar47;
            iVar45 = 0;
            if (0 < iVar33) {
              iVar45 = iVar33;
            }
            iVar33 = top_blob->dims;
            local_280 = CONCAT44(local_280._4_4_,iVar33);
            uVar52 = top_blob->c;
            if (top_blob->c < 1) {
              uVar52 = 0;
            }
            pvVar43 = pvVar49;
            for (uVar36 = 0; uVar36 != uVar52; uVar36 = uVar36 + 1) {
              iVar21 = (int)((uVar53 * lVar44 + 0xf & 0xfffffffffffffff0) / uVar53);
              if (iVar33 == 4) {
                iVar21 = (int)lVar44;
              }
              if (lVar40 == 0) {
                uVar59 = 0;
              }
              else {
                uVar59 = *(undefined4 *)(lVar40 + uVar36 * 4);
              }
              fVar150 = local_a8._M_impl.super__Vector_impl_data._M_start[uVar36];
              iVar21 = iVar21 * iVar32;
              if (iVar21 < 1) {
                iVar21 = 0;
              }
              for (lVar25 = 0; iVar21 != (int)lVar25; lVar25 = lVar25 + 1) {
                *(undefined4 *)((long)pvVar43 + lVar25 * 4) = uVar59;
              }
              lVar31 = uVar36 * 9;
              pvVar48 = (void *)(CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize) *
                                 local_2c8.cstep * uVar36 + (long)local_2c8.data);
              lVar25 = (long)local_2c8.w + (long)pvVar48;
              pvVar30 = (void *)((long)local_2c8.w * 2 + (long)pvVar48);
              pvVar55 = (void *)(lVar54 * uVar36 + (long)pvVar49);
              for (iVar21 = 0; iVar21 != iVar45; iVar21 = iVar21 + 1) {
                lVar26 = 0;
                pvVar27 = pvVar55;
                for (iVar61 = iVar47; 0 < iVar61; iVar61 = iVar61 + -1) {
                  *(float *)((long)pvVar55 + lVar26 * 4) =
                       (float)((int)*(char *)((long)pvVar7 + lVar31 + 8) *
                               (int)*(char *)((long)pvVar30 + lVar26 + 2) +
                               (int)*(char *)((long)pvVar7 + lVar31 + 7) *
                               (int)*(char *)((long)pvVar30 + lVar26 + 1) +
                              (int)*(char *)((long)pvVar7 + lVar31 + 6) *
                              (int)*(char *)((long)pvVar30 + lVar26) +
                              (int)*(char *)((long)pvVar7 + lVar31 + 5) *
                              (int)*(char *)(lVar25 + 2 + lVar26) +
                              (int)*(char *)((long)pvVar7 + lVar31 + 4) *
                              (int)*(char *)(lVar25 + 1 + lVar26) +
                              (int)*(char *)((long)pvVar7 + lVar31 + 3) *
                              (int)*(char *)(lVar25 + lVar26) +
                              (int)*(char *)((long)pvVar7 + lVar31 + 2) *
                              (int)*(char *)((long)pvVar48 + lVar26 + 2) +
                              (int)*(char *)((long)pvVar7 + lVar31 + 1) *
                              (int)*(char *)((long)pvVar48 + lVar26 + 1) +
                              (int)*(char *)((long)pvVar7 + lVar31) *
                              (int)*(char *)((long)pvVar48 + lVar26)) * fVar150 +
                       *(float *)((long)pvVar55 + lVar26 * 4);
                  pvVar27 = (void *)((long)pvVar27 + 4);
                  lVar26 = lVar26 + 1;
                }
                pvVar48 = (void *)((long)pvVar48 + lVar26 + 2);
                lVar25 = lVar25 + lVar26 + 2;
                pvVar30 = (void *)((long)pvVar30 + lVar26 + 2);
                pvVar55 = pvVar27;
              }
              pvVar43 = (void *)((long)pvVar43 + lVar54);
            }
            p_Var39 = &local_a8;
LAB_003d5fbc:
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(p_Var39);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      ((_Vector_base<float,_std::allocator<float>_> *)&opt_q);
          }
          else {
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator = (Allocator *)0x0;
            opt_q.workspace_allocator = (Allocator *)0x0;
            for (lVar40 = 0; p_Var23 = pp_Var22[-3],
                lVar40 < *(int *)(&this->field_0x108 + (long)p_Var23); lVar40 = lVar40 + 1) {
              fVar150 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var23) + lVar40 * 4);
              fVar151 = 0.0;
              if (fVar150 != 0.0) {
                fVar151 = 1.0 / (fVar150 *
                                *(float *)(*(long *)(&this->field_0x240 + (long)p_Var23) +
                                          lVar40 * 4));
              }
              _top_rescale = (void *)CONCAT44(iStack_274,fVar151);
              _scale_out = (void *)CONCAT44(uStack_1ac,
                                            *(undefined4 *)
                                             (*(long *)(&this->field_0x288 + (long)p_Var23) +
                                             lVar40 * 4));
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&scale_out);
              pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_90,
                       (vector<float,_std::allocator<float>_> *)&opt_q);
            lVar44 = (long)local_2c8.w;
            iVar47 = top_blob->w;
            iVar33 = top_blob->h;
            pvVar7 = (this->weight_data_tm).data;
            lVar40 = *(long *)(&this->field_0x1b0 + (long)p_Var23);
            uVar53 = 0;
            if (iVar33 < 1) {
              iVar33 = 0;
            }
            uVar36 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar36 = uVar53;
            }
            for (; uVar53 != uVar36; uVar53 = uVar53 + 1) {
              if (lVar40 == 0) {
                fVar150 = 0.0;
              }
              else {
                fVar150 = *(float *)(lVar40 + uVar53 * 4);
              }
              local_330 = (void *)(top_blob->cstep * uVar53 * top_blob->elemsize +
                                  (long)top_blob->data);
              fVar151 = local_90._M_impl.super__Vector_impl_data._M_start[uVar53 * 2];
              fVar152 = local_90._M_impl.super__Vector_impl_data._M_start[uVar53 * 2 + 1];
              local_340 = (void *)(local_2c8.cstep * uVar53 *
                                   CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize)
                                  + (long)local_2c8.data);
              lVar25 = uVar53 * 9;
              lVar54 = (long)local_340 + lVar44;
              pvVar49 = (void *)((long)local_340 + lVar44 * 2);
              for (iVar32 = 0; iVar32 != iVar33; iVar32 = iVar32 + 1) {
                lVar31 = 0;
                for (iVar45 = iVar47; 0 < iVar45; iVar45 = iVar45 + -1) {
                  fVar153 = roundf(((float)((int)*(char *)((long)pvVar7 + lVar25 + 8) *
                                            (int)*(char *)((long)pvVar49 + lVar31 + 2) +
                                            (int)*(char *)((long)pvVar7 + lVar25 + 7) *
                                            (int)*(char *)((long)pvVar49 + lVar31 + 1) +
                                           (int)*(char *)((long)pvVar7 + lVar25 + 6) *
                                           (int)*(char *)((long)pvVar49 + lVar31) +
                                           (int)*(char *)((long)pvVar7 + lVar25 + 5) *
                                           (int)*(char *)(lVar54 + 2 + lVar31) +
                                           (int)*(char *)((long)pvVar7 + lVar25 + 4) *
                                           (int)*(char *)(lVar54 + 1 + lVar31) +
                                           (int)*(char *)((long)pvVar7 + lVar25 + 3) *
                                           (int)*(char *)(lVar54 + lVar31) +
                                           (int)*(char *)((long)pvVar7 + lVar25 + 2) *
                                           (int)*(char *)((long)local_340 + lVar31 + 2) +
                                           (int)*(char *)((long)pvVar7 + lVar25 + 1) *
                                           (int)*(char *)((long)local_340 + lVar31 + 1) +
                                           (int)*(char *)((long)pvVar7 + lVar25) *
                                           (int)*(char *)((long)local_340 + lVar31)) * fVar151 +
                                   fVar150) * fVar152);
                  iVar21 = (int)fVar153;
                  if (iVar21 < -0x7e) {
                    iVar21 = -0x7f;
                  }
                  if (0x7e < iVar21) {
                    iVar21 = 0x7f;
                  }
                  *(char *)((long)local_330 + lVar31) = (char)iVar21;
                  lVar31 = lVar31 + 1;
                }
                local_340 = (void *)((long)local_340 + lVar31 + 2);
                lVar54 = lVar54 + lVar31 + 2;
                pvVar49 = (void *)((long)pvVar49 + lVar31 + 2);
                local_330 = (void *)((long)local_330 + lVar31);
              }
            }
            p_Var39 = &local_90;
LAB_003d6239:
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(p_Var39);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      ((_Vector_base<float,_std::allocator<float>_> *)&opt_q);
          }
          pLVar9 = this->activation;
          iVar61 = 0;
          if (pLVar9 != (Layer *)0x0) {
            (*pLVar9->_vptr_Layer[9])(pLVar9,top_blob,opt);
          }
          goto LAB_003d5694;
        }
        iVar33 = 3;
        if ((((*(int *)(&this->field_0xdc + (long)p_Var23) == 1) &&
             ((*(int *)(&this->field_0xe0 + (long)p_Var23) == 1 &&
              (*(int *)(&this->field_0xe4 + (long)p_Var23) == 2)))) &&
            (*(int *)(&this->field_0xe8 + (long)p_Var23) == 2)) &&
           (*(uint *)(&this->field_0x110 + (long)p_Var23) < 2)) {
          if (100 < iVar21) {
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator = (Allocator *)0x0;
            opt_q.workspace_allocator = (Allocator *)0x0;
            for (lVar40 = 0; p_Var23 = pp_Var22[-3],
                lVar40 < *(int *)(&this->field_0x108 + (long)p_Var23); lVar40 = lVar40 + 1) {
              fVar150 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var23) + lVar40 * 4);
              fVar151 = 0.0;
              if (fVar150 != 0.0) {
                fVar151 = 1.0 / (fVar150 *
                                *(float *)(*(long *)(&this->field_0x240 + (long)p_Var23) +
                                          lVar40 * 4));
              }
              _top_rescale = (void *)CONCAT44(iStack_274,fVar151);
              _scale_out = (void *)CONCAT44(uStack_1ac,
                                            *(undefined4 *)
                                             (*(long *)(&this->field_0x288 + (long)p_Var23) +
                                             lVar40 * 4));
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&scale_out);
              pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_c0,
                       (vector<float,_std::allocator<float>_> *)&opt_q);
            lVar44 = (long)local_2c8.w;
            iVar47 = top_blob->w;
            iVar33 = top_blob->h;
            pvVar7 = (this->weight_data_tm).data;
            lVar40 = *(long *)(&this->field_0x1b0 + (long)p_Var23);
            local_280 = lVar44 * 2;
            uVar53 = 0;
            if (iVar33 < 1) {
              iVar33 = 0;
            }
            lVar54 = (long)((local_2c8.w - iVar47) * 2);
            uVar36 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar36 = uVar53;
            }
            for (; uVar53 != uVar36; uVar53 = uVar53 + 1) {
              if (lVar40 == 0) {
                fVar150 = 0.0;
              }
              else {
                fVar150 = *(float *)(lVar40 + uVar53 * 4);
              }
              puVar51 = (undefined1 *)
                        (top_blob->cstep * uVar53 * top_blob->elemsize + (long)top_blob->data);
              fVar151 = local_c0._M_impl.super__Vector_impl_data._M_start[uVar53 * 2];
              fVar152 = local_c0._M_impl.super__Vector_impl_data._M_start[uVar53 * 2 + 1];
              local_340 = (void *)(local_2c8.cstep * uVar53 *
                                   CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize)
                                  + (long)local_2c8.data);
              lVar31 = uVar53 * 9;
              local_330 = (void *)(lVar44 + (long)local_340);
              lVar25 = (long)local_340 + local_280;
              for (iVar32 = 0; iVar32 != iVar33; iVar32 = iVar32 + 1) {
                lVar26 = 0;
                for (iVar45 = iVar47; 0 < iVar45; iVar45 = iVar45 + -1) {
                  fVar153 = roundf(((float)((int)*(char *)((long)pvVar7 + lVar31 + 8) *
                                            (int)*(char *)(lVar25 + 2 + lVar26) +
                                            (int)*(char *)((long)pvVar7 + lVar31 + 7) *
                                            (int)*(char *)(lVar25 + 1 + lVar26) +
                                           (int)*(char *)((long)pvVar7 + lVar31 + 6) *
                                           (int)*(char *)(lVar25 + lVar26) +
                                           (int)*(char *)((long)pvVar7 + lVar31 + 5) *
                                           (int)*(char *)((long)local_330 + 2 + lVar26) +
                                           (int)*(char *)((long)pvVar7 + lVar31 + 4) *
                                           (int)*(char *)((long)local_330 + 1 + lVar26) +
                                           (int)*(char *)((long)pvVar7 + lVar31 + 3) *
                                           (int)*(char *)((long)local_330 + lVar26) +
                                           (int)*(char *)((long)pvVar7 + lVar31 + 2) *
                                           (int)*(char *)((long)local_340 + lVar26 + 2) +
                                           (int)*(char *)((long)pvVar7 + lVar31 + 1) *
                                           (int)*(char *)((long)local_340 + lVar26 + 1) +
                                           (int)*(char *)((long)pvVar7 + lVar31) *
                                           (int)*(char *)((long)local_340 + lVar26)) * fVar151 +
                                   fVar150) * fVar152);
                  iVar21 = (int)fVar153;
                  if (iVar21 < -0x7e) {
                    iVar21 = -0x7f;
                  }
                  if (0x7e < iVar21) {
                    iVar21 = 0x7f;
                  }
                  *puVar51 = (char)iVar21;
                  puVar51 = puVar51 + 1;
                  lVar26 = lVar26 + 2;
                }
                local_340 = (void *)((long)local_340 + lVar26 + lVar54);
                local_330 = (void *)((long)local_330 + lVar54 + lVar26);
                lVar25 = lVar25 + lVar54 + lVar26;
              }
            }
            p_Var39 = &local_c0;
            goto LAB_003d6239;
          }
          opt_q.workspace_allocator = (Allocator *)0x0;
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator = (Allocator *)0x0;
          lVar40 = 0;
          while( true ) {
            p_Var23 = pp_Var22[-3];
            if (*(int *)(&this->field_0x108 + (long)p_Var23) <= lVar40) break;
            _top_rescale = (void *)CONCAT44(iStack_274,
                                            1.0 / (*(float *)(*(long *)(&this->field_0x1f8 +
                                                                       (long)p_Var23) + lVar40 * 4)
                                                  * *(float *)(*(long *)(&this->field_0x240 +
                                                                        (long)p_Var23) + lVar40 * 4)
                                                  ));
            std::vector<float,_std::allocator<float>_>::push_back
                      ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
            lVar40 = lVar40 + 1;
            pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
          }
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_d8,
                     (vector<float,_std::allocator<float>_> *)&opt_q);
          iVar47 = top_blob->w;
          iVar33 = top_blob->h;
          pvVar7 = (this->weight_data_tm).data;
          lVar40 = *(long *)(&this->field_0x1b0 + (long)p_Var23);
          uVar53 = top_blob->elemsize;
          lVar44 = top_blob->cstep * uVar53;
          iVar32 = 0;
          if (0 < iVar33) {
            iVar32 = iVar33;
          }
          iVar45 = top_blob->d;
          pvVar49 = top_blob->data;
          lVar54 = (long)((local_2c8.w - iVar47) * 2);
          uVar36 = (ulong)(uint)top_blob->c;
          if (top_blob->c < 1) {
            uVar36 = 0;
          }
          iVar21 = top_blob->dims;
          local_280 = CONCAT44(local_280._4_4_,iVar21);
          pvVar43 = pvVar49;
          for (uVar38 = 0; uVar38 != uVar36; uVar38 = uVar38 + 1) {
            iVar61 = (int)((uVar53 * (long)iVar33 * (long)iVar47 + 0xf & 0xfffffffffffffff0) /
                          uVar53);
            if (iVar21 == 4) {
              iVar61 = (int)((long)iVar33 * (long)iVar47);
            }
            if (lVar40 == 0) {
              uVar59 = 0;
            }
            else {
              uVar59 = *(undefined4 *)(lVar40 + uVar38 * 4);
            }
            pfVar28 = (float *)(lVar44 * uVar38 + (long)pvVar49);
            fVar150 = local_d8._M_impl.super__Vector_impl_data._M_start[uVar38];
            iVar61 = iVar61 * iVar45;
            if (iVar61 < 1) {
              iVar61 = 0;
            }
            for (lVar25 = 0; iVar61 != (int)lVar25; lVar25 = lVar25 + 1) {
              *(undefined4 *)((long)pvVar43 + lVar25 * 4) = uVar59;
            }
            lVar31 = uVar38 * 9;
            pvVar55 = (void *)(CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize) *
                               local_2c8.cstep * uVar38 + (long)local_2c8.data);
            lVar25 = (long)pvVar55 + (long)local_2c8.w;
            pvVar30 = (void *)((long)pvVar55 + (long)local_2c8.w * 2);
            for (iVar61 = 0; iVar61 != iVar32; iVar61 = iVar61 + 1) {
              lVar26 = 0;
              for (iVar34 = iVar47; 0 < iVar34; iVar34 = iVar34 + -1) {
                *pfVar28 = (float)((int)*(char *)((long)pvVar7 + lVar31 + 8) *
                                   (int)*(char *)((long)pvVar30 + lVar26 + 2) +
                                   (int)*(char *)((long)pvVar7 + lVar31 + 7) *
                                   (int)*(char *)((long)pvVar30 + lVar26 + 1) +
                                  (int)*(char *)((long)pvVar7 + lVar31 + 6) *
                                  (int)*(char *)((long)pvVar30 + lVar26) +
                                  (int)*(char *)((long)pvVar7 + lVar31 + 5) *
                                  (int)*(char *)(lVar25 + 2 + lVar26) +
                                  (int)*(char *)((long)pvVar7 + lVar31 + 4) *
                                  (int)*(char *)(lVar25 + 1 + lVar26) +
                                  (int)*(char *)((long)pvVar7 + lVar31 + 3) *
                                  (int)*(char *)(lVar25 + lVar26) +
                                  (int)*(char *)((long)pvVar7 + lVar31 + 2) *
                                  (int)*(char *)((long)pvVar55 + lVar26 + 2) +
                                  (int)*(char *)((long)pvVar7 + lVar31 + 1) *
                                  (int)*(char *)((long)pvVar55 + lVar26 + 1) +
                                  (int)*(char *)((long)pvVar7 + lVar31) *
                                  (int)*(char *)((long)pvVar55 + lVar26)) * fVar150 + *pfVar28;
                pfVar28 = pfVar28 + 1;
                lVar26 = lVar26 + 2;
              }
              pvVar55 = (void *)((long)pvVar55 + lVar26 + lVar54);
              lVar25 = lVar25 + lVar54 + lVar26;
              pvVar30 = (void *)((long)pvVar30 + lVar26 + lVar54);
            }
            pvVar43 = (void *)((long)pvVar43 + lVar44);
          }
          p_Var39 = &local_d8;
          goto LAB_003d5fbc;
        }
      }
      uVar52 = iVar33 * *(int *)(&this->field_0xd4 + (long)p_Var23);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar52,
                 (allocator_type *)&top_rescale);
      uVar19 = opt_q._0_8_;
      pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
      p_Var23 = pp_Var22[-3];
      iVar33 = *(int *)(&this->field_0xe0 + (long)p_Var23);
      iVar45 = *(int *)(&this->field_0xdc + (long)p_Var23);
      iVar61 = *(int *)(&this->field_0xd4 + (long)p_Var23);
      lVar40 = 0;
      iVar34 = 0;
      for (iVar79 = 0; iVar79 < *(int *)(&this->field_0xd8 + (long)p_Var23); iVar79 = iVar79 + 1) {
        for (lVar44 = 0; (int)lVar44 < *(int *)(&this->field_0xd4 + (long)p_Var23);
            lVar44 = lVar44 + 1) {
          *(int *)((long)(int)lVar40 * 4 + opt_q._0_8_ + lVar44 * 4) = iVar34;
          p_Var23 = pp_Var22[-3];
          iVar34 = iVar34 + *(int *)(&this->field_0xdc + (long)p_Var23);
        }
        iVar34 = iVar34 + (iVar75 * iVar33 - iVar45 * iVar61);
        lVar40 = (int)lVar40 + lVar44;
      }
      local_2f8 = 0;
      uVar29 = uVar52;
      if ((int)uVar52 < 1) {
        uVar29 = 0;
      }
      for (lVar40 = 0; pvVar7 = local_2c8.data,
          lVar40 < *(int *)(&this->field_0x108 + (long)p_Var23); lVar40 = lVar40 + 1) {
        local_328 = (float *)(top_blob->elemsize * lVar40 * top_blob->cstep + (long)top_blob->data);
        lVar54 = (long)local_2c8.w;
        lVar25 = local_2c8.cstep * lVar40;
        lVar44 = CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize);
        pvVar49 = (this->weight_data_tm).data;
        local_300 = local_328;
        for (iVar33 = 0; iVar33 <= iVar47; iVar33 = iVar33 + 1) {
          pp_Var8 = this->_vptr_ConvolutionDepthWise_x86;
          for (iVar45 = 0; iVar45 <= iVar32; iVar45 = iVar45 + 1) {
            p_Var23 = pp_Var8[-3];
            iVar61 = 0;
            for (uVar53 = 0; uVar29 != uVar53; uVar53 = uVar53 + 1) {
              iVar61 = iVar61 + (int)*(char *)((long)pvVar49 + uVar53 + local_2f8) *
                                (int)*(char *)((long)pvVar7 +
                                              (long)*(int *)(uVar19 + uVar53 * 4) +
                                              (long)iVar33 *
                                              (long)*(int *)(&this->field_0xe8 + (long)p_Var23) *
                                              lVar54 * lVar44 +
                                              (long)iVar45 *
                                              (long)*(int *)(&this->field_0xe4 + (long)p_Var23) +
                                              lVar25 * lVar44);
            }
            fVar150 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var23) + lVar40 * 4);
            fVar151 = 0.0;
            if (fVar150 != 0.0) {
              fVar151 = 1.0 / (fVar150 *
                              *(float *)(*(long *)(&this->field_0x240 + (long)p_Var23) + lVar40 * 4)
                              );
            }
            fVar151 = (float)iVar61 * fVar151;
            if (*(int *)(&this->field_0x100 + (long)p_Var23) != 0) {
              fVar151 = fVar151 + *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var23) +
                                            lVar40 * 4);
            }
            in_XMM4._0_4_ = fVar151;
            auVar58 = in_XMM4;
            switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var23)) {
            case 1:
              if (fVar151 <= 0.0) {
                auVar127._12_4_ = 0;
                auVar127._0_12_ = in_XMM4._4_12_;
                auVar58 = auVar127 << 0x20;
                in_XMM4 = auVar58;
              }
              break;
            case 2:
              auVar58 = ZEXT416((uint)((float)(-(uint)(0.0 < fVar151) & 0x3f800000 |
                                              ~-(uint)(0.0 < fVar151) &
                                              **(uint **)(&this->field_0x118 + (long)p_Var23)) *
                                      fVar151));
              break;
            case 3:
              fVar150 = **(float **)(&this->field_0x118 + (long)p_Var23);
              if (fVar151 <= fVar150) {
                in_XMM4._0_4_ = fVar150;
              }
              fVar151 = (*(float **)(&this->field_0x118 + (long)p_Var23))[1];
              auVar58 = in_XMM4;
              if (fVar151 < in_XMM4._0_4_) {
LAB_003d5528:
                auVar58 = ZEXT416((uint)fVar151);
              }
              break;
            case 4:
              if (88.37626 <= fVar151) {
                in_XMM4._0_4_ = 0x42b0c0a5;
              }
              uVar57 = -(uint)(in_XMM4._0_4_ < -88.37626);
              auVar68._4_4_ = ~in_XMM4._4_4_ & (in_XMM4._4_4_ ^ 0x80000000);
              auVar68._0_4_ = ~uVar57 & (uint)-in_XMM4._0_4_;
              auVar68._8_4_ = ~in_XMM4._8_4_ & (in_XMM4._8_4_ ^ 0x80000000);
              auVar68._12_4_ = ~in_XMM4._12_4_ & (in_XMM4._12_4_ ^ 0x80000000);
              in_XMM4 = ZEXT416(uVar57 & 0x42b0c0a5) | auVar68;
              fVar150 = expf(in_XMM4._0_4_);
              auVar58 = ZEXT416((uint)(1.0 / (fVar150 + 1.0)));
              break;
            case 5:
              fVar150 = expf(fVar151);
              fVar150 = logf(fVar150 + 1.0);
              fVar150 = tanhf(fVar150);
              auVar58._0_4_ = fVar150 * fVar151;
              auVar58._4_12_ = extraout_var;
              break;
            case 6:
              fVar150 = **(float **)(&this->field_0x118 + (long)p_Var23);
              fVar152 = (*(float **)(&this->field_0x118 + (long)p_Var23))[1];
              fVar153 = -fVar152 / fVar150;
              auVar58 = ZEXT816(0);
              if ((fVar153 <= fVar151) && (auVar58 = in_XMM4, fVar151 <= fVar153 + 1.0 / fVar150)) {
                fVar151 = (fVar150 * fVar151 + fVar152) * fVar151;
                goto LAB_003d5528;
              }
            }
            if (iVar21 < 0x65) {
              *local_300 = auVar58._0_4_;
              local_300 = local_300 + 1;
            }
            else {
              fVar150 = roundf(auVar58._0_4_ *
                               *(float *)(*(long *)(&this->field_0x288 + (long)p_Var23) + lVar40 * 4
                                         ));
              iVar61 = (int)fVar150;
              if (iVar61 < -0x7e) {
                iVar61 = -0x7f;
              }
              uVar20 = (undefined1)iVar61;
              if (0x7e < iVar61) {
                uVar20 = 0x7f;
              }
              *(undefined1 *)local_328 = uVar20;
              local_328 = (float *)((long)local_328 + 1);
            }
          }
        }
        p_Var23 = pp_Var22[-3];
        local_2f8 = local_2f8 + (int)uVar52;
      }
    }
    else {
      iVar61 = 0;
      if (iVar34 != 8) goto LAB_003d5694;
      uVar53 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) *
               (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&opt_q,uVar53,(allocator_type *)&top_rescale);
      pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
      p_Var23 = pp_Var22[-3];
      iVar33 = *(int *)(&this->field_0xe0 + (long)p_Var23);
      iVar45 = *(int *)(&this->field_0xdc + (long)p_Var23);
      iVar61 = *(int *)(&this->field_0xd4 + (long)p_Var23);
      iVar37 = 0;
      lVar40 = 0;
      for (iVar34 = 0; auVar58 = _DAT_004c6fb0, iVar34 < *(int *)(&this->field_0xd8 + (long)p_Var23)
          ; iVar34 = iVar34 + 1) {
        for (lVar44 = 0; (int)lVar44 < *(int *)(&this->field_0xd4 + (long)p_Var23);
            lVar44 = lVar44 + 1) {
          *(int *)(opt_q._0_8_ + (long)(int)lVar40 * 4 + lVar44 * 4) = iVar37;
          p_Var23 = pp_Var22[-3];
          iVar37 = iVar37 + *(int *)(&this->field_0xdc + (long)p_Var23);
        }
        iVar37 = iVar37 + (iVar75 * iVar33 - iVar45 * iVar61);
        lVar40 = (int)lVar40 + lVar44;
      }
      uVar38 = 0;
      uVar36 = uVar53 & 0xffffffff;
      if ((int)uVar53 < 1) {
        uVar36 = uVar38;
      }
      uVar50 = (ulong)(uint)iVar79;
      if (iVar79 < 1) {
        uVar50 = uVar38;
      }
      fVar150 = (float)DAT_004c6fb0;
      fVar151 = DAT_004c6fb0._4_4_;
      fVar152 = DAT_004c6fb0._8_4_;
      fVar153 = DAT_004c6fb0._12_4_;
      for (uVar35 = 0; uVar35 != uVar50; uVar35 = uVar35 + 1) {
        pauVar41 = (undefined1 (*) [16])
                   (top_blob->elemsize * uVar35 * top_blob->cstep + (long)top_blob->data);
        pvVar7 = (this->weight_data_tm).data;
        pauVar42 = pauVar41;
        for (iVar33 = 0; iVar33 <= iVar47; iVar33 = iVar33 + 1) {
          pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
          for (iVar45 = 0; auVar68 = ZEXT816(0), iVar45 <= iVar32; iVar45 = iVar45 + 1) {
            p_Var23 = pp_Var22[-3];
            iVar61 = 0;
            iVar34 = 0;
            iVar75 = 0;
            iVar79 = 0;
            iVar37 = 0;
            iVar90 = 0;
            iVar91 = 0;
            iVar93 = 0;
            for (uVar46 = 0; uVar36 != uVar46; uVar46 = uVar46 + 1) {
              uVar5 = *(ulong *)((long)local_2c8.data +
                                (long)*(int *)(opt_q._0_8_ + uVar46 * 4) * 8 +
                                (long)iVar33 * (long)*(int *)(&this->field_0xe8 + (long)p_Var23) *
                                (long)local_2c8.w *
                                CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize) +
                                (long)(*(int *)(&this->field_0xe4 + (long)p_Var23) * iVar45 * 8) +
                                local_2c8.cstep * uVar35 *
                                CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize));
              cVar111 = (char)(uVar5 >> 8);
              cVar112 = (char)(uVar5 >> 0x10);
              cVar113 = (char)(uVar5 >> 0x18);
              cVar114 = (char)(uVar5 >> 0x20);
              cVar115 = (char)(uVar5 >> 0x28);
              cVar116 = (char)(uVar5 >> 0x30);
              auVar129._8_6_ = 0;
              auVar129._0_8_ = uVar5;
              auVar129[0xe] = (char)(uVar5 >> 0x38);
              auVar129[0xf] = -((long)uVar5 < 0);
              auVar101._14_2_ = auVar129._14_2_;
              auVar101._8_5_ = 0;
              auVar101._0_8_ = uVar5;
              auVar101[0xd] = -(cVar116 < '\0');
              auVar100._13_3_ = auVar101._13_3_;
              auVar100._8_4_ = 0;
              auVar100._0_8_ = uVar5;
              auVar100[0xc] = cVar116;
              auVar99._12_4_ = auVar100._12_4_;
              auVar99._8_3_ = 0;
              auVar99._0_8_ = uVar5;
              auVar99[0xb] = -(cVar115 < '\0');
              auVar98._11_5_ = auVar99._11_5_;
              auVar98._8_2_ = 0;
              auVar98._0_8_ = uVar5;
              auVar98[10] = cVar115;
              auVar97._10_6_ = auVar98._10_6_;
              auVar97[8] = 0;
              auVar97._0_8_ = uVar5;
              auVar97[9] = -(cVar114 < '\0');
              auVar96._9_7_ = auVar97._9_7_;
              auVar96[8] = cVar114;
              auVar96._0_8_ = uVar5;
              Var12 = CONCAT91(CONCAT81(auVar96._8_8_,-(cVar113 < '\0')),cVar113);
              auVar11._2_10_ = Var12;
              auVar11[1] = -(cVar112 < '\0');
              auVar11[0] = cVar112;
              auVar10._2_12_ = auVar11;
              auVar10[1] = -(cVar111 < '\0');
              auVar10[0] = cVar111;
              auVar95._0_2_ = CONCAT11(-((char)uVar5 < '\0'),(char)uVar5);
              auVar95._2_14_ = auVar10;
              uVar5 = *(ulong *)((long)pvVar7 + uVar46 * 8 + (long)(int)uVar38);
              cVar111 = (char)(uVar5 >> 8);
              cVar112 = (char)(uVar5 >> 0x10);
              cVar113 = (char)(uVar5 >> 0x18);
              cVar114 = (char)(uVar5 >> 0x20);
              cVar115 = (char)(uVar5 >> 0x28);
              cVar116 = (char)(uVar5 >> 0x30);
              auVar126._8_6_ = 0;
              auVar126._0_8_ = uVar5;
              auVar126[0xe] = (char)(uVar5 >> 0x38);
              auVar126[0xf] = -((long)uVar5 < 0);
              auVar125._14_2_ = auVar126._14_2_;
              auVar125._8_5_ = 0;
              auVar125._0_8_ = uVar5;
              auVar125[0xd] = -(cVar116 < '\0');
              auVar124._13_3_ = auVar125._13_3_;
              auVar124._8_4_ = 0;
              auVar124._0_8_ = uVar5;
              auVar124[0xc] = cVar116;
              auVar123._12_4_ = auVar124._12_4_;
              auVar123._8_3_ = 0;
              auVar123._0_8_ = uVar5;
              auVar123[0xb] = -(cVar115 < '\0');
              auVar122._11_5_ = auVar123._11_5_;
              auVar122._8_2_ = 0;
              auVar122._0_8_ = uVar5;
              auVar122[10] = cVar115;
              auVar121._10_6_ = auVar122._10_6_;
              auVar121[8] = 0;
              auVar121._0_8_ = uVar5;
              auVar121[9] = -(cVar114 < '\0');
              auVar120._9_7_ = auVar121._9_7_;
              auVar120[8] = cVar114;
              auVar120._0_8_ = uVar5;
              Var15 = CONCAT91(CONCAT81(auVar120._8_8_,-(cVar113 < '\0')),cVar113);
              auVar14._2_10_ = Var15;
              auVar14[1] = -(cVar112 < '\0');
              auVar14[0] = cVar112;
              auVar13._2_12_ = auVar14;
              auVar13[1] = -(cVar111 < '\0');
              auVar13[0] = cVar111;
              auVar119._0_2_ = CONCAT11(-((char)uVar5 < '\0'),(char)uVar5);
              auVar119._2_14_ = auVar13;
              sVar146 = (short)Var15 * (short)Var12;
              auVar127 = pmulhw(auVar119,auVar95);
              iVar17 = CONCAT22(auVar127._6_2_,sVar146);
              Var12 = CONCAT64(CONCAT42(iVar17,auVar127._4_2_),
                               CONCAT22(auVar14._0_2_ * auVar11._0_2_,sVar146));
              auVar16._4_8_ = (long)((unkuint10)Var12 >> 0x10);
              auVar16._2_2_ = auVar127._2_2_;
              auVar16._0_2_ = auVar13._0_2_ * auVar10._0_2_;
              iVar140 = CONCAT22(auVar127._8_2_,auVar120._8_2_ * auVar96._8_2_);
              auVar141._0_8_ =
                   CONCAT26(auVar127._10_2_,CONCAT24(auVar122._10_2_ * auVar98._10_2_,iVar140));
              auVar141._8_2_ = auVar124._12_2_ * auVar100._12_2_;
              auVar141._10_2_ = auVar127._12_2_;
              auVar142._12_2_ = auVar125._14_2_ * auVar101._14_2_;
              auVar142._0_12_ = auVar141;
              auVar142._14_2_ = auVar127._14_2_;
              iVar37 = iVar37 + CONCAT22(auVar127._0_2_,auVar119._0_2_ * auVar95._0_2_);
              iVar90 = iVar90 + auVar16._0_4_;
              iVar91 = iVar91 + (int)((unkuint10)Var12 >> 0x10);
              iVar93 = iVar93 + iVar17;
              iVar61 = iVar61 + iVar140;
              iVar34 = iVar34 + (int)((ulong)auVar141._0_8_ >> 0x20);
              iVar75 = iVar75 + auVar141._8_4_;
              iVar79 = iVar79 + auVar142._12_4_;
            }
            pfVar28 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var23) + uVar35 * 0x20);
            pfVar2 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var23) + 0x10 + uVar35 * 0x20)
            ;
            pfVar1 = (float *)(*(long *)(&this->field_0x1f8 + (long)p_Var23) + uVar35 * 0x20);
            pfVar3 = (float *)(*(long *)(&this->field_0x1f8 + (long)p_Var23) + 0x10 + uVar35 * 0x20)
            ;
            auVar102._0_4_ = *pfVar28 * *pfVar1;
            auVar102._4_4_ = pfVar28[1] * pfVar1[1];
            auVar102._8_4_ = pfVar28[2] * pfVar1[2];
            auVar102._12_4_ = pfVar28[3] * pfVar1[3];
            auVar127 = rcpps(auVar102,auVar102);
            auVar128._0_4_ = *pfVar2 * *pfVar3;
            auVar128._4_4_ = pfVar2[1] * pfVar3[1];
            auVar128._8_4_ = pfVar2[2] * pfVar3[2];
            auVar128._12_4_ = pfVar2[3] * pfVar3[3];
            auVar129 = rcpps(auVar128,auVar128);
            auVar147._0_4_ = (float)iVar37 * (float)(-(uint)(*pfVar1 != 0.0) & auVar127._0_4_);
            auVar147._4_4_ = (float)iVar90 * (float)(-(uint)(pfVar1[1] != 0.0) & auVar127._4_4_);
            auVar147._8_4_ = (float)iVar91 * (float)(-(uint)(pfVar1[2] != 0.0) & auVar127._8_4_);
            auVar147._12_4_ = (float)iVar93 * (float)(-(uint)(pfVar1[3] != 0.0) & auVar127._12_4_);
            auVar63._0_4_ = (float)iVar61 * (float)(-(uint)(*pfVar3 != 0.0) & auVar129._0_4_);
            auVar63._4_4_ = (float)iVar34 * (float)(-(uint)(pfVar3[1] != 0.0) & auVar129._4_4_);
            auVar63._8_4_ = (float)iVar75 * (float)(-(uint)(pfVar3[2] != 0.0) & auVar129._8_4_);
            auVar63._12_4_ = (float)iVar79 * (float)(-(uint)(pfVar3[3] != 0.0) & auVar129._12_4_);
            if (*(int *)(&this->field_0x100 + (long)p_Var23) != 0) {
              pfVar28 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var23) + uVar35 * 0x20);
              pfVar1 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var23) + 0x10 +
                                uVar35 * 0x20);
              auVar147._0_4_ = auVar147._0_4_ + *pfVar28;
              auVar147._4_4_ = auVar147._4_4_ + pfVar28[1];
              auVar147._8_4_ = auVar147._8_4_ + pfVar28[2];
              auVar147._12_4_ = auVar147._12_4_ + pfVar28[3];
              auVar63._0_4_ = auVar63._0_4_ + *pfVar1;
              auVar63._4_4_ = auVar63._4_4_ + pfVar1[1];
              auVar63._8_4_ = auVar63._8_4_ + pfVar1[2];
              auVar63._12_4_ = auVar63._12_4_ + pfVar1[3];
            }
            auVar83 = auVar147;
            auVar103 = auVar63;
            if (5 < *(int *)(&this->field_0x110 + (long)p_Var23) - 1U)
            goto switchD_003d4901_caseD_1;
            fVar76 = auVar147._0_4_;
            fVar80 = auVar147._4_4_;
            fVar118 = auVar147._8_4_;
            fVar135 = auVar147._12_4_;
            auVar83 = maxps(auVar147,auVar68);
            fVar62 = auVar63._8_4_;
            fVar72 = auVar63._12_4_;
            auVar103 = maxps(auVar63,auVar68);
            switch(*(int *)(&this->field_0x110 + (long)p_Var23)) {
            case 2:
              auVar127 = minps(auVar147,auVar68);
              fVar62 = **(float **)(&this->field_0x118 + (long)p_Var23);
              auVar84._0_4_ = auVar83._0_4_ + auVar127._0_4_ * fVar62;
              auVar84._4_4_ = auVar83._4_4_ + auVar127._4_4_ * fVar62;
              auVar84._8_4_ = auVar83._8_4_ + auVar127._8_4_ * fVar62;
              auVar84._12_4_ = auVar83._12_4_ + auVar127._12_4_ * fVar62;
              auVar68 = minps(auVar63,auVar68);
              auVar66._0_4_ = auVar68._0_4_ * fVar62;
              auVar66._4_4_ = auVar68._4_4_ * fVar62;
              auVar66._8_4_ = auVar68._8_4_ * fVar62;
              auVar66._12_4_ = auVar68._12_4_ * fVar62;
              goto LAB_003d4fe7;
            case 3:
              uVar59 = **(undefined4 **)(&this->field_0x118 + (long)p_Var23);
              uVar4 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var23))[1];
              auVar87._4_4_ = uVar59;
              auVar87._0_4_ = uVar59;
              auVar87._8_4_ = uVar59;
              auVar87._12_4_ = uVar59;
              auVar106._4_4_ = uVar4;
              auVar106._0_4_ = uVar4;
              auVar106._8_4_ = uVar4;
              auVar106._12_4_ = uVar4;
              auVar68 = maxps(auVar147,auVar87);
              auVar83 = minps(auVar68,auVar106);
              auVar68 = maxps(auVar63,auVar87);
              auVar103 = minps(auVar68,auVar106);
              break;
            case 4:
              auVar149._0_8_ = auVar147._0_8_ ^ 0x8000000080000000;
              auVar149._8_4_ = -fVar118;
              auVar149._12_4_ = -fVar135;
              auVar68 = minps(auVar149,_DAT_004c6f70);
              auVar68 = maxps(auVar68,_DAT_004c6f80);
              fVar137 = auVar68._0_4_ * 1.442695 + 0.5;
              fVar139 = auVar68._4_4_ * 1.442695 + 0.5;
              fVar92 = auVar68._8_4_ * 1.442695 + 0.5;
              fVar94 = auVar68._12_4_ * 1.442695 + 0.5;
              fVar76 = (float)(int)fVar137;
              fVar80 = (float)(int)fVar139;
              fVar118 = (float)(int)fVar92;
              fVar135 = (float)(int)fVar94;
              fVar76 = fVar76 - (float)(-(uint)(fVar137 < fVar76) & (uint)fVar150);
              fVar80 = fVar80 - (float)(-(uint)(fVar139 < fVar80) & (uint)fVar151);
              fVar118 = fVar118 - (float)(-(uint)(fVar92 < fVar118) & (uint)fVar152);
              fVar135 = fVar135 - (float)(-(uint)(fVar94 < fVar135) & (uint)fVar153);
              fVar137 = auVar68._0_4_ - fVar76 * 0.6931472;
              fVar139 = auVar68._4_4_ - fVar80 * 0.6931472;
              fVar92 = auVar68._8_4_ - fVar118 * 0.6931472;
              fVar94 = auVar68._12_4_ - fVar135 * 0.6931472;
              auVar132._0_4_ =
                   (((((fVar137 * 0.00019875691 + 0.0013981999) * fVar137 + 0.008333452) * fVar137 +
                     0.041665796) * fVar137 + 0.16666666) * fVar137 + 0.5) * fVar137 * fVar137;
              auVar132._4_4_ =
                   (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                     0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5) * fVar139 * fVar139;
              auVar132._8_4_ =
                   (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                     0.041665796) * fVar92 + 0.16666666) * fVar92 + 0.5) * fVar92 * fVar92;
              auVar132._12_4_ =
                   (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) * fVar94 +
                     0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5) * fVar94 * fVar94;
              auVar107._0_4_ =
                   (float)((int)fVar76 * 0x800000 + (int)fVar150) *
                   (fVar137 + fVar150 + auVar132._0_4_) + fVar150;
              auVar107._4_4_ =
                   (float)((int)fVar80 * 0x800000 + (int)fVar151) *
                   (fVar139 + fVar151 + auVar132._4_4_) + fVar151;
              auVar107._8_4_ =
                   (float)((int)fVar118 * 0x800000 + (int)fVar152) *
                   (fVar92 + fVar152 + auVar132._8_4_) + fVar152;
              auVar107._12_4_ =
                   (float)((int)fVar135 * 0x800000 + (int)fVar153) *
                   (fVar94 + fVar153 + auVar132._12_4_) + fVar153;
              auVar68 = rcpps(auVar132,auVar107);
              fVar76 = auVar68._0_4_;
              fVar80 = auVar68._4_4_;
              fVar118 = auVar68._8_4_;
              fVar135 = auVar68._12_4_;
              auVar84._0_4_ = (fVar150 - auVar107._0_4_ * fVar76) * fVar76 + fVar76;
              auVar84._4_4_ = (fVar151 - auVar107._4_4_ * fVar80) * fVar80 + fVar80;
              auVar84._8_4_ = (fVar152 - auVar107._8_4_ * fVar118) * fVar118 + fVar118;
              auVar84._12_4_ = (fVar153 - auVar107._12_4_ * fVar135) * fVar135 + fVar135;
              auVar64._0_8_ = auVar63._0_8_ ^ 0x8000000080000000;
              auVar64._8_4_ = -fVar62;
              auVar64._12_4_ = -fVar72;
              auVar68 = minps(auVar64,_DAT_004c6f70);
              auVar68 = maxps(auVar68,_DAT_004c6f80);
              fVar62 = auVar68._0_4_ * 1.442695 + 0.5;
              fVar72 = auVar68._4_4_ * 1.442695 + 0.5;
              fVar76 = auVar68._8_4_ * 1.442695 + 0.5;
              fVar80 = auVar68._12_4_ * 1.442695 + 0.5;
              fVar118 = (float)(int)fVar62;
              fVar135 = (float)(int)fVar72;
              fVar137 = (float)(int)fVar76;
              fVar139 = (float)(int)fVar80;
              fVar118 = fVar118 - (float)(-(uint)(fVar62 < fVar118) & (uint)fVar150);
              fVar135 = fVar135 - (float)(-(uint)(fVar72 < fVar135) & (uint)fVar151);
              fVar137 = fVar137 - (float)(-(uint)(fVar76 < fVar137) & (uint)fVar152);
              fVar139 = fVar139 - (float)(-(uint)(fVar80 < fVar139) & (uint)fVar153);
              fVar62 = auVar68._0_4_ - fVar118 * 0.6931472;
              fVar72 = auVar68._4_4_ - fVar135 * 0.6931472;
              fVar76 = auVar68._8_4_ - fVar137 * 0.6931472;
              fVar80 = auVar68._12_4_ - fVar139 * 0.6931472;
              auVar65._0_4_ =
                   fVar62 + fVar150 +
                   (((((fVar62 * 0.00019875691 + 0.0013981999) * fVar62 + 0.008333452) * fVar62 +
                     0.041665796) * fVar62 + 0.16666666) * fVar62 + 0.5) * fVar62 * fVar62;
              auVar65._4_4_ =
                   fVar72 + fVar151 +
                   (((((fVar72 * 0.00019875691 + 0.0013981999) * fVar72 + 0.008333452) * fVar72 +
                     0.041665796) * fVar72 + 0.16666666) * fVar72 + 0.5) * fVar72 * fVar72;
              auVar65._8_4_ =
                   fVar76 + fVar152 +
                   (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) * fVar76 +
                     0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5) * fVar76 * fVar76;
              auVar65._12_4_ =
                   fVar80 + fVar153 +
                   (((((fVar80 * 0.00019875691 + 0.0013981999) * fVar80 + 0.008333452) * fVar80 +
                     0.041665796) * fVar80 + 0.16666666) * fVar80 + 0.5) * fVar80 * fVar80;
              auVar133._0_4_ =
                   (float)((int)fVar118 * 0x800000 + (int)fVar150) * auVar65._0_4_ + fVar150;
              auVar133._4_4_ =
                   (float)((int)fVar135 * 0x800000 + (int)fVar151) * auVar65._4_4_ + fVar151;
              auVar133._8_4_ =
                   (float)((int)fVar137 * 0x800000 + (int)fVar152) * auVar65._8_4_ + fVar152;
              auVar133._12_4_ =
                   (float)((int)fVar139 * 0x800000 + (int)fVar153) * auVar65._12_4_ + fVar153;
              auVar66 = rcpps(auVar65,auVar133);
              auVar103._0_4_ = (fVar150 - auVar133._0_4_ * auVar66._0_4_) * auVar66._0_4_;
              auVar103._4_4_ = (fVar151 - auVar133._4_4_ * auVar66._4_4_) * auVar66._4_4_;
              auVar103._8_4_ = (fVar152 - auVar133._8_4_ * auVar66._8_4_) * auVar66._8_4_;
              auVar103._12_4_ = (fVar153 - auVar133._12_4_ * auVar66._12_4_) * auVar66._12_4_;
LAB_003d4fe7:
              auVar108._0_4_ = auVar103._0_4_ + auVar66._0_4_;
              auVar108._4_4_ = auVar103._4_4_ + auVar66._4_4_;
              auVar108._8_4_ = auVar103._8_4_ + auVar66._8_4_;
              auVar108._12_4_ = auVar103._12_4_ + auVar66._12_4_;
              auVar83 = auVar84;
              auVar103 = auVar108;
              break;
            case 5:
              auVar68 = minps(auVar147,_DAT_004c6f70);
              auVar68 = maxps(auVar68,_DAT_004c6f80);
              fVar137 = auVar68._0_4_ * 1.442695 + 0.5;
              fVar139 = auVar68._4_4_ * 1.442695 + 0.5;
              fVar92 = auVar68._8_4_ * 1.442695 + 0.5;
              fVar94 = auVar68._12_4_ * 1.442695 + 0.5;
              fVar117 = (float)(int)fVar137;
              fVar134 = (float)(int)fVar139;
              fVar136 = (float)(int)fVar92;
              fVar138 = (float)(int)fVar94;
              fVar117 = fVar117 - (float)(-(uint)(fVar137 < fVar117) & (uint)fVar150);
              fVar134 = fVar134 - (float)(-(uint)(fVar139 < fVar134) & (uint)fVar151);
              fVar136 = fVar136 - (float)(-(uint)(fVar92 < fVar136) & (uint)fVar152);
              fVar138 = fVar138 - (float)(-(uint)(fVar94 < fVar138) & (uint)fVar153);
              fVar137 = auVar68._0_4_ - fVar117 * 0.6931472;
              fVar139 = auVar68._4_4_ - fVar134 * 0.6931472;
              fVar92 = auVar68._8_4_ - fVar136 * 0.6931472;
              fVar94 = auVar68._12_4_ - fVar138 * 0.6931472;
              auVar85._0_4_ =
                   (float)((int)fVar117 * 0x800000 + (int)fVar150) *
                   (fVar137 + fVar150 +
                   (((((fVar137 * 0.00019875691 + 0.0013981999) * fVar137 + 0.008333452) * fVar137 +
                     0.041665796) * fVar137 + 0.16666666) * fVar137 + 0.5) * fVar137 * fVar137) +
                   fVar150;
              auVar85._4_4_ =
                   (float)((int)fVar134 * 0x800000 + (int)fVar151) *
                   (fVar139 + fVar151 +
                   (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                     0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5) * fVar139 * fVar139) +
                   fVar151;
              auVar85._8_4_ =
                   (float)((int)fVar136 * 0x800000 + (int)fVar152) *
                   (fVar92 + fVar152 +
                   (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                     0.041665796) * fVar92 + 0.16666666) * fVar92 + 0.5) * fVar92 * fVar92) +
                   fVar152;
              auVar85._12_4_ =
                   (float)((int)fVar138 * 0x800000 + (int)fVar153) *
                   (fVar94 + fVar153 +
                   (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) * fVar94 +
                     0.041665796) * fVar94 + 0.16666666) * fVar94 + 0.5) * fVar94 * fVar94) +
                   fVar153;
              auVar68 = maxps(auVar85,_DAT_004c7020);
              fVar137 = (float)(auVar68._0_4_ & 0x807fffff | 0x3f000000);
              fVar92 = (float)(auVar68._4_4_ & 0x807fffff | 0x3f000000);
              fVar117 = (float)(auVar68._8_4_ & 0x807fffff | 0x3f000000);
              fVar136 = (float)(auVar68._12_4_ & 0x807fffff | 0x3f000000);
              fVar139 = fVar137 + -1.0 + (float)(-(uint)(fVar137 < 0.70710677) & (uint)fVar137);
              fVar94 = fVar92 + -1.0 + (float)(-(uint)(fVar92 < 0.70710677) & (uint)fVar92);
              fVar134 = fVar117 + -1.0 + (float)(-(uint)(fVar117 < 0.70710677) & (uint)fVar117);
              fVar138 = fVar136 + -1.0 + (float)(-(uint)(fVar136 < 0.70710677) & (uint)fVar136);
              auVar86._0_8_ =
                   CONCAT44(-(uint)(auVar85._4_4_ <= 0.0),-(uint)(auVar85._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar86._8_4_ = -(uint)(auVar85._8_4_ <= 0.0) & 0x7fffffff;
              auVar86._12_4_ = -(uint)(auVar85._12_4_ <= 0.0) & 0x7fffffff;
              auVar143._0_4_ =
                   ~-(uint)(auVar85._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar68._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar137 < 0.70710677) & (uint)fVar150)) * 0.6931472 +
                           fVar139 +
                          (((((((((fVar139 * 0.070376836 + -0.1151461) * fVar139 + 0.116769984) *
                                 fVar139 + -0.12420141) * fVar139 + 0.14249323) * fVar139 +
                              -0.16668057) * fVar139 + 0.20000714) * fVar139 + -0.24999994) *
                            fVar139 + 0.3333333) * fVar139 + -0.5) * fVar139 * fVar139) * -2.0);
              auVar143._4_4_ =
                   ~-(uint)(auVar85._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar68._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar92 < 0.70710677) & (uint)fVar151)) * 0.6931472 +
                           fVar94 + (((((((((fVar94 * 0.070376836 + -0.1151461) * fVar94 +
                                           0.116769984) * fVar94 + -0.12420141) * fVar94 +
                                         0.14249323) * fVar94 + -0.16668057) * fVar94 + 0.20000714)
                                       * fVar94 + -0.24999994) * fVar94 + 0.3333333) * fVar94 + -0.5
                                    ) * fVar94 * fVar94) * -2.0);
              auVar143._8_4_ =
                   ~-(uint)(auVar85._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar68._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar117 < 0.70710677) & (uint)fVar152)) * 0.6931472 +
                           fVar134 +
                          (((((((((fVar134 * 0.070376836 + -0.1151461) * fVar134 + 0.116769984) *
                                 fVar134 + -0.12420141) * fVar134 + 0.14249323) * fVar134 +
                              -0.16668057) * fVar134 + 0.20000714) * fVar134 + -0.24999994) *
                            fVar134 + 0.3333333) * fVar134 + -0.5) * fVar134 * fVar134) * -2.0);
              auVar143._12_4_ =
                   ~-(uint)(auVar85._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar68._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar136 < 0.70710677) & (uint)fVar153)) * 0.6931472 +
                           fVar138 +
                          (((((((((fVar138 * 0.070376836 + -0.1151461) * fVar138 + 0.116769984) *
                                 fVar138 + -0.12420141) * fVar138 + 0.14249323) * fVar138 +
                              -0.16668057) * fVar138 + 0.20000714) * fVar138 + -0.24999994) *
                            fVar138 + 0.3333333) * fVar138 + -0.5) * fVar138 * fVar138) * -2.0);
              auVar68 = minps(auVar143 | auVar86,_DAT_004c6f70);
              auVar68 = maxps(auVar68,_DAT_004c6f80);
              fVar117 = auVar68._0_4_ * 1.442695 + 0.5;
              fVar134 = auVar68._4_4_ * 1.442695 + 0.5;
              fVar136 = auVar68._8_4_ * 1.442695 + 0.5;
              fVar138 = auVar68._12_4_ * 1.442695 + 0.5;
              fVar137 = (float)(int)fVar117;
              fVar139 = (float)(int)fVar134;
              fVar92 = (float)(int)fVar136;
              fVar94 = (float)(int)fVar138;
              fVar137 = fVar137 - (float)(-(uint)(fVar117 < fVar137) & (uint)fVar150);
              fVar139 = fVar139 - (float)(-(uint)(fVar134 < fVar139) & (uint)fVar151);
              fVar92 = fVar92 - (float)(-(uint)(fVar136 < fVar92) & (uint)fVar152);
              fVar94 = fVar94 - (float)(-(uint)(fVar138 < fVar94) & (uint)fVar153);
              fVar117 = auVar68._0_4_ - fVar137 * 0.6931472;
              fVar134 = auVar68._4_4_ - fVar139 * 0.6931472;
              fVar136 = auVar68._8_4_ - fVar92 * 0.6931472;
              fVar138 = auVar68._12_4_ - fVar94 * 0.6931472;
              auVar130._0_4_ =
                   (((((fVar117 * 0.00019875691 + 0.0013981999) * fVar117 + 0.008333452) * fVar117 +
                     0.041665796) * fVar117 + 0.16666666) * fVar117 + 0.5) * fVar117 * fVar117;
              auVar130._4_4_ =
                   (((((fVar134 * 0.00019875691 + 0.0013981999) * fVar134 + 0.008333452) * fVar134 +
                     0.041665796) * fVar134 + 0.16666666) * fVar134 + 0.5) * fVar134 * fVar134;
              auVar130._8_4_ =
                   (((((fVar136 * 0.00019875691 + 0.0013981999) * fVar136 + 0.008333452) * fVar136 +
                     0.041665796) * fVar136 + 0.16666666) * fVar136 + 0.5) * fVar136 * fVar136;
              auVar130._12_4_ =
                   (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) * fVar138 +
                     0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5) * fVar138 * fVar138;
              auVar104._0_4_ =
                   (float)((int)fVar137 * 0x800000 + (int)fVar150) *
                   (fVar117 + fVar150 + auVar130._0_4_) + fVar150;
              auVar104._4_4_ =
                   (float)((int)fVar139 * 0x800000 + (int)fVar151) *
                   (fVar134 + fVar151 + auVar130._4_4_) + fVar151;
              auVar104._8_4_ =
                   (float)((int)fVar92 * 0x800000 + (int)fVar152) *
                   (fVar136 + fVar152 + auVar130._8_4_) + fVar152;
              auVar104._12_4_ =
                   (float)((int)fVar94 * 0x800000 + (int)fVar153) *
                   (fVar138 + fVar153 + auVar130._12_4_) + fVar153;
              auVar68 = rcpps(auVar130,auVar104);
              fVar137 = auVar68._0_4_;
              fVar139 = auVar68._4_4_;
              fVar92 = auVar68._8_4_;
              fVar94 = auVar68._12_4_;
              auVar83._0_4_ =
                   (fVar137 + fVar137 + -1.0 +
                   (2.0 - auVar104._0_4_ * (fVar137 + fVar137)) * fVar137) * fVar76;
              auVar83._4_4_ =
                   (fVar139 + fVar139 + -1.0 +
                   (2.0 - auVar104._4_4_ * (fVar139 + fVar139)) * fVar139) * fVar80;
              auVar83._8_4_ =
                   (fVar92 + fVar92 + -1.0 + (2.0 - auVar104._8_4_ * (fVar92 + fVar92)) * fVar92) *
                   fVar118;
              auVar83._12_4_ =
                   (fVar94 + fVar94 + -1.0 + (2.0 - auVar104._12_4_ * (fVar94 + fVar94)) * fVar94) *
                   fVar135;
              auVar68 = minps(auVar63,_DAT_004c6f70);
              auVar68 = maxps(auVar68,_DAT_004c6f80);
              fVar76 = auVar68._0_4_ * 1.442695 + 0.5;
              fVar80 = auVar68._4_4_ * 1.442695 + 0.5;
              fVar118 = auVar68._8_4_ * 1.442695 + 0.5;
              fVar135 = auVar68._12_4_ * 1.442695 + 0.5;
              fVar137 = (float)(int)fVar76;
              fVar139 = (float)(int)fVar80;
              fVar92 = (float)(int)fVar118;
              fVar94 = (float)(int)fVar135;
              fVar137 = fVar137 - (float)(-(uint)(fVar76 < fVar137) & (uint)fVar150);
              fVar139 = fVar139 - (float)(-(uint)(fVar80 < fVar139) & (uint)fVar151);
              fVar92 = fVar92 - (float)(-(uint)(fVar118 < fVar92) & (uint)fVar152);
              fVar94 = fVar94 - (float)(-(uint)(fVar135 < fVar94) & (uint)fVar153);
              fVar76 = auVar68._0_4_ - fVar137 * 0.6931472;
              fVar80 = auVar68._4_4_ - fVar139 * 0.6931472;
              fVar118 = auVar68._8_4_ - fVar92 * 0.6931472;
              fVar135 = auVar68._12_4_ - fVar94 * 0.6931472;
              auVar148._0_4_ =
                   (float)((int)fVar137 * 0x800000 + (int)fVar150) *
                   (fVar76 + fVar150 +
                   (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) * fVar76 +
                     0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5) * fVar76 * fVar76) +
                   fVar150;
              auVar148._4_4_ =
                   (float)((int)fVar139 * 0x800000 + (int)fVar151) *
                   (fVar80 + fVar151 +
                   (((((fVar80 * 0.00019875691 + 0.0013981999) * fVar80 + 0.008333452) * fVar80 +
                     0.041665796) * fVar80 + 0.16666666) * fVar80 + 0.5) * fVar80 * fVar80) +
                   fVar151;
              auVar148._8_4_ =
                   (float)((int)fVar92 * 0x800000 + (int)fVar152) *
                   (fVar118 + fVar152 +
                   (((((fVar118 * 0.00019875691 + 0.0013981999) * fVar118 + 0.008333452) * fVar118 +
                     0.041665796) * fVar118 + 0.16666666) * fVar118 + 0.5) * fVar118 * fVar118) +
                   fVar152;
              auVar148._12_4_ =
                   (float)((int)fVar94 * 0x800000 + (int)fVar153) *
                   (fVar135 + fVar153 +
                   (((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135 +
                     0.041665796) * fVar135 + 0.16666666) * fVar135 + 0.5) * fVar135 * fVar135) +
                   fVar153;
              auVar68 = maxps(auVar148,_DAT_004c7020);
              fVar76 = (float)(auVar68._0_4_ & 0x807fffff | 0x3f000000);
              fVar118 = (float)(auVar68._4_4_ & 0x807fffff | 0x3f000000);
              fVar137 = (float)(auVar68._8_4_ & 0x807fffff | 0x3f000000);
              fVar92 = (float)(auVar68._12_4_ & 0x807fffff | 0x3f000000);
              fVar80 = fVar76 + -1.0 + (float)(-(uint)(fVar76 < 0.70710677) & (uint)fVar76);
              fVar135 = fVar118 + -1.0 + (float)(-(uint)(fVar118 < 0.70710677) & (uint)fVar118);
              fVar139 = fVar137 + -1.0 + (float)(-(uint)(fVar137 < 0.70710677) & (uint)fVar137);
              fVar94 = fVar92 + -1.0 + (float)(-(uint)(fVar92 < 0.70710677) & (uint)fVar92);
              auVar144._0_8_ =
                   CONCAT44(-(uint)(auVar148._4_4_ <= 0.0),-(uint)(auVar148._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar144._8_4_ = -(uint)(auVar148._8_4_ <= 0.0) & 0x7fffffff;
              auVar144._12_4_ = -(uint)(auVar148._12_4_ <= 0.0) & 0x7fffffff;
              auVar105._0_4_ =
                   ~-(uint)(auVar148._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar68._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar76 < 0.70710677) & (uint)fVar150)) * 0.6931472 +
                           fVar80 + (((((((((fVar80 * 0.070376836 + -0.1151461) * fVar80 +
                                           0.116769984) * fVar80 + -0.12420141) * fVar80 +
                                         0.14249323) * fVar80 + -0.16668057) * fVar80 + 0.20000714)
                                       * fVar80 + -0.24999994) * fVar80 + 0.3333333) * fVar80 + -0.5
                                    ) * fVar80 * fVar80) * -2.0);
              auVar105._4_4_ =
                   ~-(uint)(auVar148._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar68._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar118 < 0.70710677) & (uint)fVar151)) * 0.6931472 +
                           fVar135 +
                          (((((((((fVar135 * 0.070376836 + -0.1151461) * fVar135 + 0.116769984) *
                                 fVar135 + -0.12420141) * fVar135 + 0.14249323) * fVar135 +
                              -0.16668057) * fVar135 + 0.20000714) * fVar135 + -0.24999994) *
                            fVar135 + 0.3333333) * fVar135 + -0.5) * fVar135 * fVar135) * -2.0);
              auVar105._8_4_ =
                   ~-(uint)(auVar148._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar68._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar137 < 0.70710677) & (uint)fVar152)) * 0.6931472 +
                           fVar139 +
                          (((((((((fVar139 * 0.070376836 + -0.1151461) * fVar139 + 0.116769984) *
                                 fVar139 + -0.12420141) * fVar139 + 0.14249323) * fVar139 +
                              -0.16668057) * fVar139 + 0.20000714) * fVar139 + -0.24999994) *
                            fVar139 + 0.3333333) * fVar139 + -0.5) * fVar139 * fVar139) * -2.0);
              auVar105._12_4_ =
                   ~-(uint)(auVar148._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar68._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar92 < 0.70710677) & (uint)fVar153)) * 0.6931472 +
                           fVar94 + (((((((((fVar94 * 0.070376836 + -0.1151461) * fVar94 +
                                           0.116769984) * fVar94 + -0.12420141) * fVar94 +
                                         0.14249323) * fVar94 + -0.16668057) * fVar94 + 0.20000714)
                                       * fVar94 + -0.24999994) * fVar94 + 0.3333333) * fVar94 + -0.5
                                    ) * fVar94 * fVar94) * -2.0);
              auVar68 = minps(auVar105 | auVar144,_DAT_004c6f70);
              auVar68 = maxps(auVar68,_DAT_004c6f80);
              fVar76 = auVar68._0_4_ * 1.442695 + 0.5;
              fVar80 = auVar68._4_4_ * 1.442695 + 0.5;
              fVar118 = auVar68._8_4_ * 1.442695 + 0.5;
              fVar135 = auVar68._12_4_ * 1.442695 + 0.5;
              fVar137 = (float)(int)fVar76;
              fVar139 = (float)(int)fVar80;
              fVar92 = (float)(int)fVar118;
              fVar94 = (float)(int)fVar135;
              fVar137 = fVar137 - (float)(-(uint)(fVar76 < fVar137) & (uint)fVar150);
              fVar139 = fVar139 - (float)(-(uint)(fVar80 < fVar139) & (uint)fVar151);
              fVar92 = fVar92 - (float)(-(uint)(fVar118 < fVar92) & (uint)fVar152);
              fVar94 = fVar94 - (float)(-(uint)(fVar135 < fVar94) & (uint)fVar153);
              fVar76 = auVar68._0_4_ - fVar137 * 0.6931472;
              fVar80 = auVar68._4_4_ - fVar139 * 0.6931472;
              fVar118 = auVar68._8_4_ - fVar92 * 0.6931472;
              fVar135 = auVar68._12_4_ - fVar94 * 0.6931472;
              auVar131._0_4_ = fVar76 * fVar76;
              auVar131._4_4_ = fVar80 * fVar80;
              auVar131._8_4_ = fVar118 * fVar118;
              auVar131._12_4_ = fVar135 * fVar135;
              auVar145._0_4_ =
                   (float)((int)fVar137 * 0x800000 + (int)fVar150) *
                   (fVar76 + fVar150 +
                   (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) * fVar76 +
                     0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5) * auVar131._0_4_) + fVar150
              ;
              auVar145._4_4_ =
                   (float)((int)fVar139 * 0x800000 + (int)fVar151) *
                   (fVar80 + fVar151 +
                   (((((fVar80 * 0.00019875691 + 0.0013981999) * fVar80 + 0.008333452) * fVar80 +
                     0.041665796) * fVar80 + 0.16666666) * fVar80 + 0.5) * auVar131._4_4_) + fVar151
              ;
              auVar145._8_4_ =
                   (float)((int)fVar92 * 0x800000 + (int)fVar152) *
                   (fVar118 + fVar152 +
                   (((((fVar118 * 0.00019875691 + 0.0013981999) * fVar118 + 0.008333452) * fVar118 +
                     0.041665796) * fVar118 + 0.16666666) * fVar118 + 0.5) * auVar131._8_4_) +
                   fVar152;
              auVar145._12_4_ =
                   (float)((int)fVar94 * 0x800000 + (int)fVar153) *
                   (fVar135 + fVar153 +
                   (((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135 +
                     0.041665796) * fVar135 + 0.16666666) * fVar135 + 0.5) * auVar131._12_4_) +
                   fVar153;
              auVar68 = rcpps(auVar131,auVar145);
              fVar76 = auVar68._0_4_;
              fVar80 = auVar68._4_4_;
              fVar118 = auVar68._8_4_;
              fVar135 = auVar68._12_4_;
              auVar110._0_4_ =
                   fVar76 + fVar76 + -1.0 + (2.0 - auVar145._0_4_ * (fVar76 + fVar76)) * fVar76;
              auVar110._4_4_ =
                   fVar80 + fVar80 + -1.0 + (2.0 - auVar145._4_4_ * (fVar80 + fVar80)) * fVar80;
              auVar110._8_4_ =
                   fVar118 + fVar118 + -1.0 + (2.0 - auVar145._8_4_ * (fVar118 + fVar118)) * fVar118
              ;
              auVar110._12_4_ =
                   fVar135 + fVar135 + -1.0 +
                   (2.0 - auVar145._12_4_ * (fVar135 + fVar135)) * fVar135;
              goto LAB_003d5029;
            case 6:
              fVar137 = **(float **)(&this->field_0x118 + (long)p_Var23);
              fVar139 = (*(float **)(&this->field_0x118 + (long)p_Var23))[1];
              auVar88._0_4_ = fVar137 * fVar76 + fVar139;
              auVar88._4_4_ = fVar137 * fVar80 + fVar139;
              auVar88._8_4_ = fVar137 * fVar118 + fVar139;
              auVar88._12_4_ = fVar137 * fVar135 + fVar139;
              auVar127 = maxps(auVar88,auVar68);
              auVar127 = minps(auVar127,auVar58);
              auVar83._0_4_ = auVar127._0_4_ * fVar76;
              auVar83._4_4_ = auVar127._4_4_ * fVar80;
              auVar83._8_4_ = auVar127._8_4_ * fVar118;
              auVar83._12_4_ = auVar127._12_4_ * fVar135;
              auVar109._0_4_ = fVar137 * auVar63._0_4_ + fVar139;
              auVar109._4_4_ = fVar137 * auVar63._4_4_ + fVar139;
              auVar109._8_4_ = fVar137 * fVar62 + fVar139;
              auVar109._12_4_ = fVar137 * fVar72 + fVar139;
              auVar68 = maxps(auVar109,auVar68);
              auVar110 = minps(auVar68,auVar58);
LAB_003d5029:
              auVar103._0_4_ = auVar110._0_4_ * auVar63._0_4_;
              auVar103._4_4_ = auVar110._4_4_ * auVar63._4_4_;
              auVar103._8_4_ = auVar110._8_4_ * fVar62;
              auVar103._12_4_ = auVar110._12_4_ * fVar72;
            }
switchD_003d4901_caseD_1:
            if (iVar21 < 0x65) {
              *pauVar42 = auVar83;
              pauVar42[1] = auVar103;
              pauVar42 = pauVar42 + 2;
            }
            else {
              pfVar28 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var23) + uVar35 * 0x20);
              pfVar1 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var23) + 0x10 +
                                uVar35 * 0x20);
              fVar62 = *pfVar28 * auVar83._0_4_;
              fVar72 = pfVar28[1] * auVar83._4_4_;
              fVar76 = pfVar28[2] * auVar83._8_4_;
              fVar80 = pfVar28[3] * auVar83._12_4_;
              fVar118 = *pfVar1 * auVar103._0_4_;
              fVar135 = pfVar1[1] * auVar103._4_4_;
              fVar137 = pfVar1[2] * auVar103._8_4_;
              fVar139 = pfVar1[3] * auVar103._12_4_;
              auVar67._0_4_ = (int)((float)((uint)fVar62 & 0x80000000 | 0x3f000000) + fVar62);
              auVar67._4_4_ = (int)((float)((uint)fVar72 & 0x80000000 | 0x3f000000) + fVar72);
              auVar67._8_4_ = (int)((float)((uint)fVar76 & 0x80000000 | 0x3f000000) + fVar76);
              auVar67._12_4_ = (int)((float)((uint)fVar80 & 0x80000000 | 0x3f000000) + fVar80);
              auVar89._0_4_ = (int)((float)((uint)fVar118 & 0x80000000 | 0x3f000000) + fVar118);
              auVar89._4_4_ = (int)((float)((uint)fVar135 & 0x80000000 | 0x3f000000) + fVar135);
              auVar89._8_4_ = (int)((float)((uint)fVar137 & 0x80000000 | 0x3f000000) + fVar137);
              auVar89._12_4_ = (int)((float)((uint)fVar139 & 0x80000000 | 0x3f000000) + fVar139);
              auVar68 = packssdw(auVar67,auVar89);
              sVar146 = auVar68._0_2_;
              uVar60 = (ushort)(0x7f < sVar146) * 0x7f | (ushort)(0x7f >= sVar146) * sVar146;
              sVar146 = auVar68._2_2_;
              uVar70 = (ushort)(0x7f < sVar146) * 0x7f | (ushort)(0x7f >= sVar146) * sVar146;
              sVar146 = auVar68._4_2_;
              uVar71 = (ushort)(0x7f < sVar146) * 0x7f | (ushort)(0x7f >= sVar146) * sVar146;
              sVar146 = auVar68._6_2_;
              uVar73 = (ushort)(0x7f < sVar146) * 0x7f | (ushort)(0x7f >= sVar146) * sVar146;
              sVar146 = auVar68._8_2_;
              uVar74 = (ushort)(0x7f < sVar146) * 0x7f | (ushort)(0x7f >= sVar146) * sVar146;
              sVar146 = auVar68._10_2_;
              uVar77 = (ushort)(0x7f < sVar146) * 0x7f | (ushort)(0x7f >= sVar146) * sVar146;
              sVar146 = auVar68._12_2_;
              sVar82 = auVar68._14_2_;
              uVar78 = (ushort)(0x7f < sVar146) * 0x7f | (ushort)(0x7f >= sVar146) * sVar146;
              uVar81 = (ushort)(0x7f < sVar82) * 0x7f | (ushort)(0x7f >= sVar82) * sVar82;
              auVar69._0_2_ =
                   (ushort)((short)uVar60 < -0x7f) * -0x7f | ((short)uVar60 >= -0x7f) * uVar60;
              auVar69._2_2_ =
                   (ushort)((short)uVar70 < -0x7f) * -0x7f | ((short)uVar70 >= -0x7f) * uVar70;
              auVar69._4_2_ =
                   (ushort)((short)uVar71 < -0x7f) * -0x7f | ((short)uVar71 >= -0x7f) * uVar71;
              auVar69._6_2_ =
                   (ushort)((short)uVar73 < -0x7f) * -0x7f | ((short)uVar73 >= -0x7f) * uVar73;
              auVar69._8_2_ =
                   (ushort)((short)uVar74 < -0x7f) * -0x7f | ((short)uVar74 >= -0x7f) * uVar74;
              auVar69._10_2_ =
                   (ushort)((short)uVar77 < -0x7f) * -0x7f | ((short)uVar77 >= -0x7f) * uVar77;
              auVar69._12_2_ =
                   (ushort)((short)uVar78 < -0x7f) * -0x7f | ((short)uVar78 >= -0x7f) * uVar78;
              auVar69._14_2_ =
                   (ushort)((short)uVar81 < -0x7f) * -0x7f | ((short)uVar81 >= -0x7f) * uVar81;
              auVar68 = packsswb(auVar69,auVar69);
              *(long *)*pauVar41 = auVar68._0_8_;
              pauVar41 = (undefined1 (*) [16])((long)*pauVar41 + 8);
            }
          }
        }
        uVar38 = (ulong)(uint)((int)uVar38 + (int)uVar53 * 8);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
    iVar61 = 0;
    goto LAB_003d5694;
  }
  uVar57 = *(uint *)(&this->field_0xd0 + (long)p_Var23);
  iVar47 = *(int *)(&this->field_0x10c + (long)p_Var23);
  if (opt->use_packing_layout == true) {
    if (iVar47 < 0x65) {
      uVar53 = (ulong)((uint)((uVar57 & 3) == 0) * 3 + 1);
    }
    else {
      uVar53 = 1;
      if ((uVar57 & 7) == 0) {
        uVar53 = 8;
      }
    }
  }
  else {
    uVar53 = 1;
  }
  iVar61 = -100;
  _elempack = (uint)uVar53;
  uVar36 = (ulong)(_elempack * 4);
  if (100 < iVar47) {
    uVar36 = uVar53;
  }
  Mat::create(top_blob,iVar33,iVar45,(int)uVar57 / (int)_elempack,uVar36,_elempack,
              opt->blob_allocator);
  auVar58 = (undefined1  [16])opt_q._48_16_;
  sVar18 = local_2c8.cstep;
  if ((top_blob->data == (void *)0x0) || (iVar61 = iVar21, (long)top_blob->c * top_blob->cstep == 0)
     ) goto LAB_003d5694;
  uVar38 = (long)(int)uVar29 /
           (long)*(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
  uVar50 = (long)*(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) /
           (long)*(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
  if (opt->use_packing_layout == true) {
    uVar29 = 1;
    if ((uVar38 & 7) == 0) {
      uVar29 = uVar52;
    }
    if (iVar47 < 0x65) {
      uVar57 = (uint)((uVar50 & 3) == 0) * 3 + 1;
    }
    else {
      uVar57 = 1;
      if ((uVar50 & 7) == 0) {
        uVar57 = uVar52;
      }
    }
  }
  else {
    uVar29 = 1;
    uVar57 = uVar29;
  }
  opt_q.blob_allocator = (Allocator *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
  opt_q._0_8_ = local_2c8.data;
  opt_q.workspace_allocator =
       (Allocator *)CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize);
  opt_q.openmp_blocktime = local_2c8.elempack;
  opt_q._32_8_ = local_2c8.allocator;
  opt_q._44_4_ = local_2c8.w;
  opt_q._40_4_ = local_2c8.dims;
  opt_q.use_local_pool_allocator = (bool)(undefined1)local_2c8.d;
  opt_q.use_shader_local_memory = (bool)local_2c8.d._1_1_;
  opt_q.use_cooperative_matrix = (bool)local_2c8.d._2_1_;
  opt_q.use_winograd23_convolution = (bool)local_2c8.d._3_1_;
  opt_q.flush_denormals = local_2c8.h;
  opt_q._60_4_ = auVar58._12_4_;
  opt_q.use_winograd43_convolution = (bool)(undefined1)local_2c8.c;
  opt_q.use_winograd63_convolution = (bool)local_2c8.c._1_1_;
  opt_q.use_reserved_6 = (bool)local_2c8.c._2_1_;
  opt_q.use_reserved_7 = (bool)local_2c8.c._3_1_;
  if (opt_q.blob_allocator != (Allocator *)0x0) {
    LOCK();
    *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
         *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + 1;
    UNLOCK();
  }
  local_340 = (void *)(uVar38 & 0xffffffff);
  pvVar49 = local_340;
  pvVar7 = (void *)uVar38;
  if ((int)uVar29 < iVar34) {
    _top_rescale = *(void **)opt;
    local_268 = opt->workspace_allocator;
    iStack_260 = opt->openmp_blocktime;
    unique0x10001997 = opt->use_winograd_convolution;
    unique0x10001998 = opt->use_sgemm_convolution;
    unique0x10001999 = opt->use_int8_inference;
    unique0x1000199a = opt->use_vulkan_compute;
    local_258 = *(Allocator **)&opt->use_bf16_storage;
    _iStack_250 = *(undefined8 *)&opt->use_shader_pack8;
    _local_248 = *(undefined8 *)&opt->flush_denormals;
    _iStack_240 = *(undefined8 *)&opt->use_winograd43_convolution;
    pAStack_270 = opt->workspace_allocator;
    convert_packing(&local_2c8,(Mat *)&opt_q,uVar29,(Option *)&top_rescale);
    pvVar7 = (void *)(uVar38 & 0xffffffff);
  }
  _top_rescale = top_blob->data;
  pAStack_270 = (Allocator *)top_blob->refcount;
  local_268 = (Allocator *)top_blob->elemsize;
  iStack_260 = top_blob->elempack;
  local_258 = top_blob->allocator;
  iStack_250 = top_blob->dims;
  iStack_24c = top_blob->w;
  local_248 = top_blob->h;
  iStack_244 = top_blob->d;
  iStack_240 = top_blob->c;
  local_238 = top_blob->cstep;
  if (pAStack_270 != (Allocator *)0x0) {
    LOCK();
    *(int *)&pAStack_270->_vptr_Allocator = *(int *)&pAStack_270->_vptr_Allocator + 1;
    UNLOCK();
  }
  if (uVar57 < _elempack) {
    local_300._0_1_ = (byte)uVar36;
    Mat::create((Mat *)&top_rescale,iVar33,iVar45,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) /
                (int)uVar57,(ulong)((byte)((byte)local_300 / (byte)uVar53) * uVar57),uVar57,
                opt->workspace_allocator);
    pvVar7 = (void *)(uVar38 & 0xffffffff);
    iVar61 = -100;
    if ((_top_rescale != (void *)0x0) && ((long)iStack_240 * local_238 != 0)) goto LAB_003d42b1;
  }
  else {
LAB_003d42b1:
    iVar33 = 0;
    iVar47 = 0;
    for (lVar40 = 0; auVar58 = (undefined1  [16])opt_q._48_16_, uVar19 = opt_q._40_8_,
        lVar40 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
        lVar40 = lVar40 + 1) {
      local_178 = (int)pvVar7 / (int)uVar29;
      _scale_out = (void *)((long)(iVar33 / (int)uVar29) * sVar18 * (long)opt_q.workspace_allocator
                           + opt_q._0_8_);
      local_1a8 = (int *)0x0;
      local_1a0 = opt_q.workspace_allocator;
      local_198 = opt_q.openmp_blocktime;
      local_190 = (long *)opt_q._32_8_;
      local_184 = opt_q.use_subgroup_shuffle;
      bStack_183 = opt_q.use_image_storage;
      bStack_182 = opt_q.use_tensor_storage;
      bStack_181 = opt_q.use_reserved_0;
      local_180 = opt_q.flush_denormals;
      local_17c = opt_q.use_local_pool_allocator;
      bStack_17b = opt_q.use_shader_local_memory;
      bStack_17a = opt_q.use_cooperative_matrix;
      bStack_179 = opt_q.use_winograd23_convolution;
      local_170 = ((long)(int)opt_q._52_4_ * (long)opt_q.workspace_allocator *
                   (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_ + 0xfU & 0xfffffffffffffff0
                  ) / (ulong)opt_q.workspace_allocator;
      opt_q._40_4_ = SUB84(uVar19,0);
      local_188 = opt_q.use_shader_pack8;
      bStack_187 = opt_q.use_subgroup_basic;
      bStack_186 = opt_q.use_subgroup_vote;
      bStack_185 = opt_q.use_subgroup_ballot;
      m_1.data = (void *)((long)(iVar47 / (int)uVar57) * local_238 * (long)local_268 +
                         (long)_top_rescale);
      m_1.refcount = (int *)0x0;
      m_1.elemsize = (size_t)local_268;
      m_1.elempack = iStack_260;
      m_1.allocator = local_258;
      m_1.w = iStack_24c;
      m_1.h = local_248;
      m_1.d = iStack_244;
      m_1.c = (int)((long)((ulong)(uint)((int)uVar50 >> 0x1f) << 0x20 | uVar50 & 0xffffffff) /
                   (long)(int)uVar57);
      m_1.cstep = ((long)iStack_244 * (long)local_268 * (long)local_248 * (long)iStack_24c + 0xfU &
                  0xfffffffffffffff0) / (ulong)local_268;
      m_1.dims = iStack_250;
      pLVar9 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar40];
      opt_g.lightmode = opt->lightmode;
      opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_g.num_threads = opt->num_threads;
      opt_g.workspace_allocator._0_4_ = *(undefined4 *)&opt->workspace_allocator;
      opt_g.workspace_allocator._4_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4);
      opt_g.openmp_blocktime = opt->openmp_blocktime;
      opt_g.use_winograd_convolution = opt->use_winograd_convolution;
      opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_g.use_int8_inference = opt->use_int8_inference;
      opt_g.use_vulkan_compute = opt->use_vulkan_compute;
      opt_g.use_bf16_storage = opt->use_bf16_storage;
      opt_g.use_fp16_packed = opt->use_fp16_packed;
      opt_g.use_fp16_storage = opt->use_fp16_storage;
      opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_g.use_int8_packed = opt->use_int8_packed;
      opt_g.use_int8_storage = opt->use_int8_storage;
      opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_g.use_packing_layout = opt->use_packing_layout;
      opt_g.use_shader_pack8 = opt->use_shader_pack8;
      opt_g.use_subgroup_basic = opt->use_subgroup_basic;
      opt_g.use_subgroup_vote = opt->use_subgroup_vote;
      opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_g.use_image_storage = opt->use_image_storage;
      opt_g.use_tensor_storage = opt->use_tensor_storage;
      opt_g.use_reserved_0 = opt->use_reserved_0;
      opt_g.flush_denormals = opt->flush_denormals;
      opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_g.use_shader_local_memory = opt->use_shader_local_memory;
      opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
      opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
      opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
      opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
      opt_g.use_reserved_6 = opt->use_reserved_6;
      opt_g.use_reserved_7 = opt->use_reserved_7;
      opt_g.use_reserved_8 = opt->use_reserved_8;
      opt_g.use_reserved_9 = opt->use_reserved_9;
      opt_g.use_reserved_10 = opt->use_reserved_10;
      opt_g.use_reserved_11 = opt->use_reserved_11;
      opt_g.blob_allocator = local_258;
      opt_q._40_8_ = uVar19;
      opt_q._48_16_ = auVar58;
      (*pLVar9->_vptr_Layer[7])(pLVar9,&scale_out,&m_1,&opt_g);
      local_340._0_4_ = (int)uVar38;
      if (m_1.refcount != (int *)0x0) {
        LOCK();
        *m_1.refcount = *m_1.refcount + -1;
        UNLOCK();
        if (*m_1.refcount == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            free(m_1.data);
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_1a8 != (int *)0x0) {
        LOCK();
        *local_1a8 = *local_1a8 + -1;
        UNLOCK();
        if (*local_1a8 == 0) {
          if (local_190 == (long *)0x0) {
            free(_scale_out);
          }
          else {
            (**(code **)(*local_190 + 0x18))();
          }
        }
      }
      iVar47 = iVar47 + (int)uVar50;
      iVar33 = iVar33 + (int)local_340;
      pvVar7 = pvVar49;
    }
    if (uVar57 < _elempack) {
      iVar61 = 0;
      convert_packing((Mat *)&top_rescale,top_blob,_elempack,opt);
    }
    else {
      iVar61 = 0;
      if ((Mat *)&top_rescale != top_blob) {
        if (pAStack_270 != (Allocator *)0x0) {
          LOCK();
          *(int *)&pAStack_270->_vptr_Allocator = *(int *)&pAStack_270->_vptr_Allocator + 1;
          UNLOCK();
        }
        piVar6 = top_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = _top_rescale;
        top_blob->refcount = (int *)pAStack_270;
        top_blob->elemsize = (size_t)local_268;
        top_blob->elempack = iStack_260;
        top_blob->allocator = local_258;
        top_blob->dims = iStack_250;
        top_blob->w = iStack_24c;
        top_blob->h = local_248;
        top_blob->d = iStack_244;
        top_blob->c = iStack_240;
        top_blob->cstep = local_238;
      }
    }
  }
  if (pAStack_270 != (Allocator *)0x0) {
    LOCK();
    *(int *)&pAStack_270->_vptr_Allocator = *(int *)&pAStack_270->_vptr_Allocator + -1;
    UNLOCK();
    if (*(int *)&pAStack_270->_vptr_Allocator == 0) {
      if (local_258 == (Allocator *)0x0) {
        free(_top_rescale);
      }
      else {
        (*local_258->_vptr_Allocator[3])();
      }
    }
  }
  if (opt_q.blob_allocator != (Allocator *)0x0) {
    LOCK();
    *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
         *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
    UNLOCK();
    if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
      if (opt_q._32_8_ == 0) {
        free((void *)opt_q._0_8_);
      }
      else {
        (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
      }
    }
  }
LAB_003d5694:
  piVar6 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_2c8.allocator == (Allocator *)0x0) {
        free(local_2c8.data);
      }
      else {
        (*(local_2c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_120.refcount != (int *)0x0) {
    LOCK();
    *local_120.refcount = *local_120.refcount + -1;
    UNLOCK();
    if (*local_120.refcount == 0) {
      if (local_120.allocator == (Allocator *)0x0) {
        free(local_120.data);
      }
      else {
        (*(local_120.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar61;
}

Assistant:

int ConvolutionDepthWise_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}